

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_stock_trading_action *m)

{
  byte bVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  invalid_argument *this_00;
  __hash_code __code;
  undefined1 uVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  p_Var4 = (_Hash_node_base *)(ulong)m->StockLocate;
  uVar2 = (this->order_book_id_map)._M_h._M_bucket_count;
  uVar6 = (ulong)p_Var4 % uVar2;
  p_Var7 = (this->order_book_id_map)._M_h._M_buckets[uVar6 & 0xffffffff];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var7->_M_nxt[1]._M_nxt != p_Var4)) {
    while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar6) ||
         (p_Var8 = p_Var7, p_Var3[1]._M_nxt == p_Var4)) goto LAB_0011376b;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0011376b:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var8->_M_nxt;
  }
  if (p_Var4 != (_Hash_node_base *)0x0) {
    bVar1 = m->TradingState;
    if (bVar1 < 0x51) {
      uVar5 = 1;
      if (bVar1 != 0x48) {
        if (bVar1 != 0x50) {
LAB_001137b4:
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,"invalid trading state: ","");
          std::__cxx11::to_string(&local_60,(int)m->TradingState);
          std::operator+(&local_40,&local_80,&local_60);
          std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        uVar5 = 2;
      }
    }
    else if (bVar1 == 0x51) {
      uVar5 = 3;
    }
    else {
      if (bVar1 != 0x54) goto LAB_001137b4;
      uVar5 = 4;
    }
    *(undefined1 *)&p_Var4[7]._M_nxt = uVar5;
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_stock_trading_action* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        switch (m->TradingState) {
        case 'H': ob.set_state(trading_state::halted); break;
        case 'P': ob.set_state(trading_state::paused); break;
        case 'Q': ob.set_state(trading_state::quotation_only); break;
        case 'T': ob.set_state(trading_state::trading); break;
        default:  throw std::invalid_argument(std::string("invalid trading state: ") + std::to_string(m->TradingState));
        }
    }
}